

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::BackUp(CopyingOutputStreamAdaptor *this,int count)

{
  int iVar1;
  long v1;
  long extraout_RAX;
  Nonnull<const_char_*> pcVar2;
  long in_RCX;
  LogMessage LStack_18;
  
  if (count == 0) {
    WriteBuffer(this);
    return;
  }
  if (count < 0) {
    BackUp();
    v1 = extraout_RAX;
  }
  else {
    iVar1 = this->buffer_used_;
    v1 = (long)iVar1;
    in_RCX = (long)this->buffer_size_;
    if (iVar1 == this->buffer_size_) {
      if (count <= iVar1) {
        this->buffer_used_ = iVar1 - count;
        return;
      }
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)(uint)count,v1,"count <= buffer_used_");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x148,pcVar2);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&LStack_18,
                 (char (*) [78])
                 " Can\'t back up over more bytes than were returned by the last call to Next().");
      goto LAB_002e1cce;
    }
  }
  pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     (v1,in_RCX,"buffer_used_ == buffer_size_");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x146,pcVar2);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&LStack_18,(char (*) [43])" BackUp() can only be called after Next().");
LAB_002e1cce:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

void CopyingOutputStreamAdaptor::BackUp(int count) {
  if (count == 0) {
    Flush();
    return;
  }
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK_EQ(buffer_used_, buffer_size_)
      << " BackUp() can only be called after Next().";
  ABSL_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";

  buffer_used_ -= count;
}